

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O0

void HBLAS3::
     hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double,(char)84,(char)84,100ul,100ul,100ul>
               (void)

{
  quaternion<double> ALPHA_00;
  quaternion<double> ALPHA_01;
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  reference A_00;
  type __y;
  quaternion<double> *pqVar4;
  reference pvVar5;
  reference X;
  rep_conflict rVar6;
  value_type tstVal;
  quaternion<double> refVal;
  size_t indx;
  size_t i;
  int32_t BStart;
  size_t j;
  int32_t BStride;
  duration<double,_std::ratio<1L,_1L>_> gemmDur;
  time_point gemmEnd;
  time_point gemmStart;
  string BetaFstr;
  string AlphaFstr;
  string BFstr;
  string AFstr;
  double BETA;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> SCR;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> CC;
  quaternion<double> *x_2;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end0;
  iterator __begin0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> C;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> B;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  size_t LDC;
  size_t LDB;
  size_t LDA;
  size_t NM;
  size_t KM;
  size_t NK;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff958;
  undefined1 pv_;
  quaternion<double> *__y_00;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  *in_stack_fffffffffffff960;
  quaternion<double> *__x;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
  *plVar7;
  allocator_type *in_stack_fffffffffffff970;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *this;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff980;
  int32_t in_stack_fffffffffffff98c;
  int32_t in_stack_fffffffffffff99c;
  undefined8 in_stack_fffffffffffff9a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9b0;
  quaternion<double> *__q;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  int32_t iVar9;
  undefined4 in_stack_fffffffffffff9e4;
  undefined4 uVar10;
  double in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  quaternion<double> *B_00;
  int32_t in_stack_fffffffffffffa00;
  int32_t in_stack_fffffffffffffa10;
  basic_cstring<const_char> local_4d8 [15];
  undefined1 local_3e8 [32];
  undefined8 local_3c8;
  undefined1 local_360 [24];
  undefined1 local_348 [16];
  basic_cstring<const_char> local_338;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  size_type local_2c8;
  ulong local_2c0;
  quaternion<double> *local_2b8;
  quaternion<double> *pqStack_2b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
  *plStack_2a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *pvStack_2a0;
  int local_294;
  ulong local_290;
  undefined4 local_284;
  rep local_280;
  duration<double,_std::ratio<1L,_1L>_> local_278;
  undefined8 local_270;
  quaternion<double> *local_268;
  quaternion<double> *pqStack_260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
  *plStack_258;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *pvStack_250;
  undefined8 local_248;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  double local_1c0;
  quaternion<double> *local_1b8;
  quaternion<double> *pqStack_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
  *plStack_1a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *pvStack_1a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_190;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_178;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  reference local_140;
  quaternion<double> *local_138;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_130;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  reference local_100;
  quaternion<double> *local_f8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_f0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  reference local_c0;
  quaternion<double> *local_b8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_98;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_78 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = 10000;
  local_10 = 10000;
  local_18 = 10000;
  local_20 = 100;
  local_28 = 100;
  local_30 = 100;
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x241644);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x241670);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x241695);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x2416c1);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x2416e6);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x241712);
  local_a8 = &local_48;
  local_b0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff958);
  local_b8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff958);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff960,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff958);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_b0);
    genRandom<HAXX::quaternion<double>>();
    local_c0->_M_real = local_e0;
    local_c0->_M_imag_i = local_d8;
    local_c0->_M_imag_j = local_d0;
    local_c0->_M_imag_k = local_c8;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_b0);
  }
  local_e8 = local_78;
  local_f0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff958);
  local_f8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff958);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff960,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff958);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_f0);
    genRandom<HAXX::quaternion<double>>();
    local_100->_M_real = local_120;
    local_100->_M_imag_i = local_118;
    local_100->_M_imag_j = local_110;
    local_100->_M_imag_k = local_108;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_f0);
  }
  local_128 = &local_98;
  local_130._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff958);
  local_138 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        (in_stack_fffffffffffff958);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff960,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff958);
    iVar9 = (int32_t)in_stack_fffffffffffff9f0;
    if (!bVar1) break;
    local_140 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_130);
    genRandom<HAXX::quaternion<double>>();
    local_140->_M_real = local_160;
    local_140->_M_imag_i = local_158;
    local_140->_M_imag_j = local_150;
    local_140->_M_imag_k = local_148;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_130);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x241a12);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x241a3b);
  genRandom<HAXX::quaternion<double>>();
  local_1c0 = genRandom<double>();
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<double>();
  std::operator<<((ostream *)&std::cout,"\n HBLAS GEMM TEST: \n");
  std::operator<<((ostream *)&std::cout,"   - _F =      DOUBLE    \n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AF =     ");
  poVar2 = std::operator<<(poVar2,local_1e0);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BF =     ");
  poVar2 = std::operator<<(poVar2,local_200);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AlphaF = ");
  poVar2 = std::operator<<(poVar2,local_220);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BetaF =  ");
  poVar2 = std::operator<<(poVar2,local_240);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _TA =     ");
  poVar2 = std::operator<<(poVar2,'T');
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _TB =     ");
  poVar2 = std::operator<<(poVar2,'T');
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"\n   PROBLEM DIMENSIONS\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - N =     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - M =     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - K =     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - LDA =   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - LDB =   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"     - LDC =   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  local_248 = std::chrono::_V2::system_clock::now();
  local_268 = local_1b8;
  pqStack_260 = pqStack_1b0;
  plStack_258 = plStack_1a8;
  pvStack_250 = pvStack_1a0;
  B_00 = (quaternion<double> *)0x0;
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
            (&local_48,0);
  pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](local_78,(size_type)B_00);
  uVar10 = (undefined4)local_28;
  A_00 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
         operator[](&local_98,(size_type)B_00);
  ALPHA_01._M_imag_i = (double)in_stack_fffffffffffff9d8;
  ALPHA_01._M_real = (double)in_stack_fffffffffffff9d0;
  ALPHA_01._M_imag_j._0_4_ = in_stack_fffffffffffff9e0;
  ALPHA_01._M_imag_j._4_4_ = in_stack_fffffffffffff9e4;
  ALPHA_01._M_imag_k = in_stack_fffffffffffff9e8;
  pqVar4 = pqStack_260;
  plVar7 = plStack_258;
  this = pvStack_250;
  HAXX::
  HBLAS_GEMM<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            ((char)((ulong)in_stack_fffffffffffff9a0 >> 0x38),
             (char)((ulong)in_stack_fffffffffffff9a0 >> 0x30),(int32_t)in_stack_fffffffffffff9a0,
             in_stack_fffffffffffff99c,(int32_t)local_30,ALPHA_01,A_00,iVar9,B_00,
             in_stack_fffffffffffffa00,(double)CONCAT44(in_stack_fffffffffffff98c,uVar10),pvVar3,
             in_stack_fffffffffffffa10);
  local_270 = std::chrono::_V2::system_clock::now();
  __y = std::chrono::operator-
                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)plVar7,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)pqVar4);
  local_280 = __y.__r;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)plVar7);
  pqVar4 = (quaternion<double> *)
           std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)pqVar4," * GEMM took ");
  iVar9 = (int32_t)poVar2;
  uVar10 = (undefined4)((ulong)poVar2 >> 0x20);
  rVar6 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_278);
  poVar2 = (ostream *)std::ostream::operator<<((void *)CONCAT44(uVar10,iVar9),rVar6);
  std::operator<<(poVar2," s\n\n");
  local_284 = (undefined4)local_28;
  for (local_290 = 0; local_290 < 100; local_290 = local_290 + 1) {
    local_294 = (int)local_290;
    local_2b8 = local_1b8;
    pqStack_2b0 = pqStack_1b0;
    plStack_2a8 = plStack_1a8;
    pvStack_2a0 = pvStack_1a0;
    __q = (quaternion<double> *)0x0;
    pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_48,0);
    uVar8 = (undefined4)local_20;
    pvVar5 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](local_78,(long)local_294);
    uVar10 = local_284;
    X = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_190,(size_type)__q);
    ALPHA_00._M_imag_i._0_4_ = in_stack_fffffffffffff9c8;
    ALPHA_00._M_real = (double)pvVar3;
    ALPHA_00._M_imag_i._4_4_ = uVar8;
    ALPHA_00._M_imag_j = (double)pvVar5;
    ALPHA_00._M_imag_k = (double)poVar2;
    __y_00 = local_2b8;
    __x = pqStack_2b0;
    plVar7 = plStack_2a8;
    this = pvStack_2a0;
    HAXX::
    HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
              ((char)((ulong)in_stack_fffffffffffff9a0 >> 0x38),(int32_t)in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff99c,ALPHA_00,A_00,in_stack_fffffffffffff98c,X,iVar9,
               (double)CONCAT44(in_stack_fffffffffffff97c,uVar10),pqVar4,(int32_t)__y.__r);
    for (local_2c0 = 0; local_2c0 < 100; local_2c0 = local_2c0 + 1) {
      local_2c8 = local_2c0 + local_290 * local_30;
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_190,local_2c0);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_178,local_2c8);
      HAXX::operator*(&__x->_M_real,__y_00);
      HAXX::operator+(__x,__y_00);
      pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
               operator[](&local_98,local_2c8);
      local_328 = pvVar3->_M_real;
      local_320 = pvVar3->_M_imag_i;
      local_318 = pvVar3->_M_imag_j;
      local_310 = pvVar3->_M_imag_k;
      do {
        in_stack_fffffffffffff9a0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)__x)
        ;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff9a0,&local_338,0x88,local_348);
        HAXX::inv<double>(__q);
        HAXX::operator*(B_00,(quaternion<double> *)__y.__r);
        local_3c8 = 0x3ff0000000000000;
        HAXX::operator-(__x,&__y_00->_M_real);
        pv_ = (undefined1)((ulong)__y_00 >> 0x38);
        HAXX::norm<double>(X);
        boost::test_tools::assertion_result::assertion_result((assertion_result *)__x,(bool)pv_);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<(&plVar7->super_lazy_ostream,(char (*) [7])__x);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]> *)
                   plVar7,(unsigned_long *)__x);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)plVar7,(char (*) [6])__x);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)plVar7,(unsigned_long *)__x);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)plVar7,(char (*) [16])__x);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)plVar7,__x);
        boost::unit_test::operator<<(plVar7,(char (*) [15])__x);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)plVar7,__x);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (local_4d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        __y_00 = (quaternion<double> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_360,local_3e8,local_4d8,0x88,1);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x2424d4);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)0x2424e1);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x2424ee);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)0x2424fb);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x242508);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)0x242515);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x242522);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>
                            *)0x24252f);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x24253c);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  return;
}

Assistant:

void hblas3_gemm() {

  size_t NK = N*K;
  size_t KM = K*M;
  size_t NM = N*M;

  size_t LDA = ( _TA == 'N' ) ? N : K;
  size_t LDB = ( _TB == 'N' ) ? K : M;
  size_t LDC = N;

  // Random Quaternion vectors and matricies
  std::vector<_AF> A(NK);
  std::vector<_BF> B(KM);
  std::vector<qd>  C(NM);

  for(auto &x : A) x = genRandom<_AF>();
  for(auto &x : B) x = genRandom<_BF>();
  for(auto &x : C) x = genRandom<qd> ();

  std::vector<qd> CC(C);
  std::vector<qd> SCR(N);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA  = genRandom<_BetaF>();


  std::string AFstr     = t_str<_AF>(); 
  std::string BFstr     = t_str<_BF>(); 
  std::string AlphaFstr = t_str<_AlphaF>(); 
  std::string BetaFstr  = t_str<_BetaF>(); 
                
                


  std::cout << "\n HBLAS GEMM TEST: \n";
  std::cout << "   - _F =      DOUBLE    \n";
  std::cout << "   - _AF =     " << AFstr << "\n";
  std::cout << "   - _BF =     " << BFstr << "\n";
  std::cout << "   - _AlphaF = " << AlphaFstr << "\n";
  std::cout << "   - _BetaF =  " << BetaFstr << "\n";
  std::cout << "   - _TA =     " << _TA << "\n";
  std::cout << "   - _TB =     " << _TB << "\n";

  std::cout << "\n   PROBLEM DIMENSIONS\n";
  std::cout << "     - N =     " << N << "\n";
  std::cout << "     - M =     " << M << "\n";
  std::cout << "     - K =     " << K << "\n";
  std::cout << "     - LDA =   " << LDA << "\n";
  std::cout << "     - LDB =   " << LDB << "\n";
  std::cout << "     - LDC =   " << LDC << "\n";



  std::cout << "\n";



  auto gemmStart = std::chrono::high_resolution_clock::now();

  HBLAS_GEMM(_TA, _TB, N, M, K, ALPHA, &A[0], LDA, &B[0], LDB, BETA, 
    &C[0], LDC);

  auto gemmEnd = std::chrono::high_resolution_clock::now();

  std::chrono::duration<double> gemmDur = gemmEnd - gemmStart;
  std::cout << std::endl << " * GEMM took " << gemmDur.count() 
    << " s\n\n";


  HAXX_INT BStride = 1;
  if( _TB != 'N' ) BStride = LDB;
  if( _TB == 'C' ) 
    for(auto &x : B) x = HAXX::conj(x); 

  for(size_t j = 0; j < M; j++) {

    HAXX_INT BStart = j;
    if( _TB == 'N' ) BStart *= LDB;

    HBLAS_GEMV(_TA, N, K, ALPHA, &A[0], LDA, &B[BStart], BStride, 0., 
      &SCR[0], 1);

    for(size_t i = 0; i < N; i++) {

      size_t indx = RANK2_INDX(i,j,LDC);
      auto refVal = SCR[i] + BETA*CC[indx];
      auto tstVal = C[indx];

      BOOST_CHECK_MESSAGE( 
        CMP_Q( refVal, tstVal ),
        "\n i = " << i << 
          " j = " << j << 
          ", HBLAS_GEMM = " << tstVal << 
          ", REFERENCE = "  << refVal 
      );
    }
  }

}